

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

plutovg_path_t * plutovg_path_create(void)

{
  plutovg_path_t *ppVar1;
  plutovg_path_t *path;
  
  ppVar1 = (plutovg_path_t *)malloc(0x28);
  ppVar1->ref_count = 1;
  ppVar1->num_points = 0;
  ppVar1->num_contours = 0;
  ppVar1->num_curves = 0;
  (ppVar1->start_point).x = 0.0;
  (ppVar1->start_point).y = 0.0;
  (ppVar1->elements).data = (plutovg_path_element_t *)0x0;
  (ppVar1->elements).size = 0;
  (ppVar1->elements).capacity = 0;
  return ppVar1;
}

Assistant:

plutovg_path_t* plutovg_path_create(void)
{
    plutovg_path_t* path = malloc(sizeof(plutovg_path_t));
    path->ref_count = 1;
    path->num_points = 0;
    path->num_contours = 0;
    path->num_curves = 0;
    path->start_point = PLUTOVG_EMPTY_POINT;
    plutovg_array_init(path->elements);
    return path;
}